

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_xor(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  run_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int32_t pos2;
  run_container_t *unaff_retaddr;
  int32_t pos1;
  int32_t neededcapacity;
  int local_24;
  int local_20;
  
  if (in_RDX->capacity < *in_RDI + *in_RSI) {
    run_container_grow(unaff_retaddr,(int32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)
                      );
  }
  local_20 = 0;
  local_24 = 0;
  in_RDX->n_runs = 0;
  while( true ) {
    bVar1 = false;
    if (local_20 < *in_RDI) {
      bVar1 = local_24 < *in_RSI;
    }
    if (!bVar1) break;
    if (*(ushort *)(*(long *)(in_RSI + 2) + (long)local_24 * 4) <
        *(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 4)) {
      run_container_smart_append_exclusive
                (in_RDX,*(uint16_t *)(*(long *)(in_RSI + 2) + (long)local_24 * 4),
                 *(uint16_t *)(*(long *)(in_RSI + 2) + 2 + (long)local_24 * 4));
      local_24 = local_24 + 1;
    }
    else {
      run_container_smart_append_exclusive
                (in_RDX,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)local_20 * 4),
                 *(uint16_t *)(*(long *)(in_RDI + 2) + 2 + (long)local_20 * 4));
      local_20 = local_20 + 1;
    }
  }
  for (; local_20 < *in_RDI; local_20 = local_20 + 1) {
    run_container_smart_append_exclusive
              (in_RDX,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)local_20 * 4),
               *(uint16_t *)(*(long *)(in_RDI + 2) + 2 + (long)local_20 * 4));
  }
  for (; local_24 < *in_RSI; local_24 = local_24 + 1) {
    run_container_smart_append_exclusive
              (in_RDX,*(uint16_t *)(*(long *)(in_RSI + 2) + (long)local_24 * 4),
               *(uint16_t *)(*(long *)(in_RSI + 2) + 2 + (long)local_24 * 4));
  }
  return;
}

Assistant:

void run_container_xor(const run_container_t *src_1,
                       const run_container_t *src_2, run_container_t *dst) {
    // don't bother to convert xor with full range into negation
    // since negation is implemented similarly

    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);

    int32_t pos1 = 0;
    int32_t pos2 = 0;
    dst->n_runs = 0;

    while ((pos1 < src_1->n_runs) && (pos2 < src_2->n_runs)) {
        if (src_1->runs[pos1].value <= src_2->runs[pos2].value) {
            run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                                 src_1->runs[pos1].length);
            pos1++;
        } else {
            run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                                 src_2->runs[pos2].length);
            pos2++;
        }
    }
    while (pos1 < src_1->n_runs) {
        run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                             src_1->runs[pos1].length);
        pos1++;
    }

    while (pos2 < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                             src_2->runs[pos2].length);
        pos2++;
    }
}